

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall cimg_library::CImg<char>::CImg(CImg<char> *this,CImg<char> *img)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ulong __n;
  
  pcVar5 = img->_data;
  if (pcVar5 != (char *)0x0) {
    uVar2 = img->_height;
    uVar3 = img->_depth;
    uVar4 = img->_spectrum;
    __n = (ulong)uVar3 * (ulong)uVar4 * (ulong)uVar2 * (ulong)img->_width;
    if (__n != 0) {
      this->_width = img->_width;
      this->_height = uVar2;
      this->_depth = uVar3;
      this->_spectrum = uVar4;
      bVar1 = img->_is_shared;
      this->_is_shared = bVar1;
      if (bVar1 == true) {
        this->_data = pcVar5;
        return;
      }
      pcVar5 = (char *)operator_new__(__n);
      this->_data = pcVar5;
      memcpy(pcVar5,img->_data,__n);
      return;
    }
  }
  this->_data = (char *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_depth = 0;
  this->_spectrum = 0;
  this->_is_shared = false;
  return;
}

Assistant:

CImg(const CImg<T>& img) {
      const size_t siz = (size_t)img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        _is_shared = img._is_shared;
        if (_is_shared) _data = const_cast<T*>(img._data);
        else {
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*img._width*img._height*img._depth*img._spectrum),
                                        img._width,img._height,img._depth,img._spectrum);

          }
          std::memcpy(_data,img._data,siz*sizeof(T));
        }
      } else { _width = _height = _depth = _spectrum = 0; _is_shared = false; _data = 0; }
    }